

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::SaveTo(Builder *this,Version *v)

{
  long lVar1;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __last;
  bool bVar2;
  int iVar3;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __first;
  Builder *pBVar4;
  char *pcVar5;
  char *pcVar6;
  FileMetaData *in_RSI;
  long in_FS_OFFSET;
  InternalKey *this_begin;
  InternalKey *prev_end;
  uint32_t i;
  FileMetaData **added_file;
  FileSet *__range3;
  FileSet *added_files;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *base_files;
  int level;
  const_iterator bpos;
  iterator __end3;
  iterator __begin3;
  const_iterator base_end;
  const_iterator base_iter;
  BySmallestKey cmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_fffffffffffffeb0;
  InternalKey *in_stack_fffffffffffffeb8;
  FILE *__stream;
  InternalKey *in_stack_fffffffffffffec0;
  Version *in_stack_fffffffffffffec8;
  Builder *in_stack_fffffffffffffed0;
  FileMetaData *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  BySmallestKey in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  uint local_cc;
  int local_a4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a4 = 0;
  do {
    if (6 < local_a4) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::begin
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_fffffffffffffeb0);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::end
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_fffffffffffffeb0);
    __first._M_current =
         (FileMetaData **)
         std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                   ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    in_stack_fffffffffffffea8);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::size((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
            *)in_stack_fffffffffffffea8);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_fffffffffffffee8.internal_comparator,
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::begin(in_stack_fffffffffffffeb0);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::end(in_stack_fffffffffffffeb0);
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffeb8,
                                   (_Self *)in_stack_fffffffffffffeb0), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator*
                ((_Rb_tree_const_iterator<leveldb::FileMetaData_*> *)in_stack_fffffffffffffea8);
      __last._M_current._4_4_ = in_stack_fffffffffffffef4;
      __last._M_current._0_4_ = in_stack_fffffffffffffef0;
      std::
      upper_bound<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,leveldb::FileMetaData*,leveldb::VersionSet::Builder::BySmallestKey>
                (__first,__last,(FileMetaData **)in_stack_fffffffffffffec0,in_stack_fffffffffffffee8
                );
      while (bVar2 = __gnu_cxx::
                     operator==<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                               ((__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                                 *)in_stack_fffffffffffffeb8,
                                (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                                 *)in_stack_fffffffffffffeb0), ((bVar2 ^ 0xffU) & 1) != 0) {
        in_stack_fffffffffffffee8.internal_comparator = (InternalKeyComparator *)in_RSI;
        in_stack_fffffffffffffef4 = local_a4;
        __gnu_cxx::
        __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
        ::operator*((__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                     *)in_stack_fffffffffffffea8);
        MaybeAddFile(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),in_stack_fffffffffffffed8);
        __gnu_cxx::
        __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
        ::operator++((__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                      *)in_stack_fffffffffffffea8);
      }
      MaybeAddFile(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),in_stack_fffffffffffffed8);
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator++
                ((_Rb_tree_const_iterator<leveldb::FileMetaData_*> *)in_stack_fffffffffffffea8);
    }
    while (bVar2 = __gnu_cxx::
                   operator==<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                             ((__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                               *)in_stack_fffffffffffffeb8,
                              (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                               *)in_stack_fffffffffffffeb0), ((bVar2 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffed8 = in_RSI;
      in_stack_fffffffffffffee4 = local_a4;
      __gnu_cxx::
      __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
      ::operator*((__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                   *)in_stack_fffffffffffffea8);
      MaybeAddFile(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),in_stack_fffffffffffffed8);
      __gnu_cxx::
      __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
      ::operator++((__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                    *)in_stack_fffffffffffffea8);
    }
    if (0 < local_a4) {
      local_cc = 1;
      while( true ) {
        in_stack_fffffffffffffed0 = (Builder *)(ulong)local_cc;
        pBVar4 = (Builder *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      in_stack_fffffffffffffea8);
        if (pBVar4 <= in_stack_fffffffffffffed0) break;
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   in_stack_fffffffffffffeb8,(size_type)in_stack_fffffffffffffeb0);
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   in_stack_fffffffffffffeb8,(size_type)in_stack_fffffffffffffeb0);
        iVar3 = InternalKeyComparator::Compare
                          ((InternalKeyComparator *)in_stack_fffffffffffffec8,
                           in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        if (-1 < iVar3) {
          __stream = _stderr;
          InternalKey::DebugString_abi_cxx11_
                    ((InternalKey *)in_stack_fffffffffffffee8.internal_comparator);
          pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(in_stack_fffffffffffffea8);
          InternalKey::DebugString_abi_cxx11_
                    ((InternalKey *)in_stack_fffffffffffffee8.internal_comparator);
          pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(in_stack_fffffffffffffea8);
          fprintf(__stream,"overlapping ranges in same level %s vs. %s\n",pcVar5,pcVar6);
          std::__cxx11::string::~string(in_stack_fffffffffffffea8);
          std::__cxx11::string::~string(in_stack_fffffffffffffea8);
          abort();
        }
        local_cc = local_cc + 1;
      }
    }
    local_a4 = local_a4 + 1;
  } while( true );
}

Assistant:

void SaveTo(Version* v) {
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      // Merge the set of added files with the set of pre-existing files.
      // Drop any deleted files.  Store the result in *v.
      const std::vector<FileMetaData*>& base_files = base_->files_[level];
      std::vector<FileMetaData*>::const_iterator base_iter = base_files.begin();
      std::vector<FileMetaData*>::const_iterator base_end = base_files.end();
      const FileSet* added_files = levels_[level].added_files;
      v->files_[level].reserve(base_files.size() + added_files->size());
      for (const auto& added_file : *added_files) {
        // Add all smaller files listed in base_
        for (std::vector<FileMetaData*>::const_iterator bpos =
                 std::upper_bound(base_iter, base_end, added_file, cmp);
             base_iter != bpos; ++base_iter) {
          MaybeAddFile(v, level, *base_iter);
        }

        MaybeAddFile(v, level, added_file);
      }

      // Add remaining base files
      for (; base_iter != base_end; ++base_iter) {
        MaybeAddFile(v, level, *base_iter);
      }

#ifndef NDEBUG
      // Make sure there is no overlap in levels > 0
      if (level > 0) {
        for (uint32_t i = 1; i < v->files_[level].size(); i++) {
          const InternalKey& prev_end = v->files_[level][i - 1]->largest;
          const InternalKey& this_begin = v->files_[level][i]->smallest;
          if (vset_->icmp_.Compare(prev_end, this_begin) >= 0) {
            fprintf(stderr, "overlapping ranges in same level %s vs. %s\n",
                    prev_end.DebugString().c_str(),
                    this_begin.DebugString().c_str());
            abort();
          }
        }
      }
#endif
    }
  }